

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_AddVar_Test::TestBody(ProblemTest_AddVar_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  Type TVar3;
  char *pcVar4;
  BasicProblem<mp::BasicProblemParams<int>_> *message;
  Variable VVar5;
  MutVariable MVar6;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Variable cvar;
  Variable var;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Problem p;
  type *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff8e4;
  double *in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  char *in_stack_fffffffffffff8f8;
  int iVar8;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff900;
  Type in_stack_fffffffffffff90c;
  Type type;
  AssertHelper *in_stack_fffffffffffff910;
  AssertHelper *this_00;
  undefined8 in_stack_fffffffffffff918;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff930;
  Message *in_stack_fffffffffffff958;
  AssertHelper *in_stack_fffffffffffff960;
  AssertionResult local_5e8 [2];
  char *local_5c8;
  undefined8 local_5c0;
  AssertionResult local_5b8 [2];
  AssertHelper *local_598;
  undefined8 local_590;
  AssertionResult local_588 [2];
  undefined4 local_568;
  undefined4 local_564;
  AssertionResult local_560;
  BasicProblem<mp::BasicProblemParams<int>_> *local_550;
  int local_548;
  BasicProblem<mp::BasicProblemParams<int>_> *local_540;
  int local_538;
  BasicProblem<mp::BasicProblemParams<int>_> *local_530;
  int local_528;
  BasicProblem<mp::BasicProblemParams<int>_> *local_520;
  int local_518;
  int local_500;
  undefined4 local_4fc;
  AssertionResult local_4f8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_4e8;
  int local_4e0;
  Type local_4c8;
  undefined4 local_4c4;
  AssertionResult local_4c0 [2];
  double local_4a0;
  undefined8 local_498;
  AssertionResult local_490 [2];
  double local_470;
  undefined8 local_468;
  AssertionResult local_460 [2];
  undefined4 local_440;
  undefined4 local_43c;
  AssertionResult local_438;
  BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_428;
  BasicProblem<mp::BasicProblemParams<int>_> *local_410;
  int local_408;
  BasicProblem<mp::BasicProblemParams<int>_> *local_400;
  int local_3f8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3f0;
  int local_3e8;
  BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_> local_3e0 [2];
  int local_3c0;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3a8;
  int local_3a0;
  int local_378;
  undefined4 local_374;
  AssertionResult local_370 [55];
  
  TVar3 = (Type)((ulong)in_stack_fffffffffffff918 >> 0x20);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(in_stack_fffffffffffff900);
  local_374 = 0;
  local_378 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_vars
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x1133ac);
  testing::internal::EqHelper<true>::Compare<int,int>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (int *)in_stack_fffffffffffff8e8,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             in_stack_fffffffffffff8d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x11345b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x1134be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113516);
  VVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar
                    (in_stack_fffffffffffff930,
                     (double)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (double)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),TVar3);
  local_3a8 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_3a0 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_3bc = 1;
  local_3c0 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_vars
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x11357c);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (int *)in_stack_fffffffffffff8e8,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x11361f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x113682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1136da);
  pcVar4 = (char *)0x0;
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                     (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
  local_400 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3f8 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_3f0 = local_400;
  local_3e8 = local_3f8;
  VVar5 = mp::BasicProblem::MutVariable::operator_cast_to_BasicVariable((MutVariable *)0x113743);
  local_428.problem_ =
       VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_408 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_428._12_4_ = local_3e0[0]._12_4_;
  local_428.index_ = local_408;
  local_43c = 0;
  local_410 = local_428.problem_;
  local_3e0[0].problem_ = local_428.problem_;
  local_3e0[0].index_ = local_408;
  pcVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>::index
                     (&local_428,pcVar4,local_408);
  local_440 = SUB84(pcVar4,0);
  testing::internal::EqHelper<true>::Compare<int,int>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (int *)in_stack_fffffffffffff8e8,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             in_stack_fffffffffffff8d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x113870);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x1138d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11392b);
  local_468 = 0x3ff199999999999a;
  local_470 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::lb((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    *)0x11394a);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             in_stack_fffffffffffff8e8,
             (double *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x113a03);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x113a66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113abe);
  local_498 = 0x400199999999999a;
  local_4a0 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::ub((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    *)0x113add);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             in_stack_fffffffffffff8e8,
             (double *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x113b96);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x113bf9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113c51);
  local_4c4 = 0;
  local_4c8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
              BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)0x113c69);
  testing::internal::EqHelper<false>::Compare<mp::var::Type,mp::var::Type>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (Type *)in_stack_fffffffffffff8e8,
             (Type *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    in_stack_fffffffffffff960 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x113d1c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x113d7f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113dd7);
  VVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar
                    (in_stack_fffffffffffff930,
                     (double)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                     (double)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),TVar3);
  message = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
            problem_;
  local_4e0 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_4fc = 2;
  local_4e8 = message;
  local_500 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_vars
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x113e3a);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (int *)in_stack_fffffffffffff8e8,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x113ed7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x113f34);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x113f8c);
  pcVar4 = (char *)0x1;
  MVar6 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
                     (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
  local_540 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_538 = MVar6.
              super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_530 = local_540;
  local_528 = local_538;
  VVar5 = mp::BasicProblem::MutVariable::operator_cast_to_BasicVariable((MutVariable *)0x113fec);
  local_550 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_548 = VVar5.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_564 = 1;
  local_520 = local_550;
  local_518 = local_548;
  local_3e0[0].problem_ = local_550;
  local_3e0[0].index_ = local_548;
  pcVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>::index
                     (local_3e0,pcVar4,local_548);
  local_568 = SUB84(pcVar4,0);
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             (int *)in_stack_fffffffffffff8e8,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff910);
    testing::AssertionResult::failure_message((AssertionResult *)0x11410a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff910,in_stack_fffffffffffff90c,(char *)in_stack_fffffffffffff900
               ,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x114167);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1141bf);
  local_590 = 0x400a666666666666;
  this_00 = (AssertHelper *)
            mp::BasicProblem<mp::BasicProblemParams<int>_>::
            BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::lb((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)0x1141de);
  local_598 = this_00;
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffff8f8,
             (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             in_stack_fffffffffffff8e8,
             (double *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  iVar8 = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff90c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff900 =
         (BasicProblem<mp::BasicProblemParams<int>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x11428b);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffff900,iVar8,
               (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x1142e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114340);
  local_5c0 = 0x401199999999999a;
  pcVar4 = (char *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
                   BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   ::ub((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                         *)0x11435f);
  local_5c8 = pcVar4;
  testing::internal::EqHelper<false>::Compare<double,double>
            (pcVar4,(char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0),
             in_stack_fffffffffffff8e8,
             (double *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_5b8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff8e8 =
         (double *)testing::AssertionResult::failure_message((AssertionResult *)0x11440c);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffff900,(int)((ulong)pcVar4 >> 0x20),
               (char *)CONCAT17(uVar2,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    testing::Message::~Message((Message *)0x114469);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1144c1);
  TVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ::type((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)0x1144d9);
  testing::internal::EqHelper<false>::Compare<mp::var::Type,mp::var::Type>
            (pcVar4,(char *)CONCAT17(uVar2,in_stack_fffffffffffff8f0),
             (Type *)in_stack_fffffffffffff8e8,(Type *)CONCAT44(TVar3,in_stack_fffffffffffff8e0));
  iVar8 = (int)((ulong)pcVar4 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5e8);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x114580);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffff900,iVar8,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffff8f0));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff960,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(TVar3,uVar7));
    testing::Message::~Message((Message *)0x1145db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x114630);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)CONCAT44(TVar3,uVar7));
  return;
}

Assistant:

TEST(ProblemTest, AddVar) {
  Problem p;
  EXPECT_EQ(0, p.num_vars());
  p.AddVar(1.1, 2.2);
  EXPECT_EQ(1, p.num_vars());
  Problem::Variable var = p.var(0);
  const Problem::Variable cvar = var;
  EXPECT_EQ(0, cvar.index());
  EXPECT_EQ(1.1, cvar.lb());
  EXPECT_EQ(2.2, cvar.ub());
  EXPECT_EQ(mp::var::CONTINUOUS, cvar.type());
  p.AddVar(3.3, 4.4, mp::var::INTEGER);
  EXPECT_EQ(2, p.num_vars());
  var = p.var(1);
  EXPECT_EQ(1, var.index());
  EXPECT_EQ(3.3, var.lb());
  EXPECT_EQ(4.4, var.ub());
  EXPECT_EQ(mp::var::INTEGER, var.type());
}